

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O0

void basic_suite::value_false(void)

{
  size_type sVar1;
  UI_STRING *uis;
  char *ui;
  undefined4 local_218;
  value local_214 [2];
  undefined1 local_20c;
  undefined1 local_20b [43];
  error *ex_6;
  error *ex_5;
  error *ex_4;
  error *ex_3;
  error *ex_2;
  error *ex_1;
  error *ex;
  value local_b8 [2];
  undefined4 local_b0;
  value local_ac [6];
  undefined4 local_94;
  value local_90 [2];
  undefined1 local_88 [8];
  reader reader;
  value_type input [1];
  
  reader.stack.c.
  super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node._7_1_ = 0x80;
  trial::protocol::bintoken::reader::reader<unsigned_char[1]>
            ((reader *)local_88,
             (uchar (*) [1])
             ((long)&reader.stack.c.
                     super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                     ._M_impl.super__Deque_impl_data._M_finish + 0x1f));
  local_90[0] = trial::protocol::bintoken::reader::code((reader *)local_88);
  local_94 = 0x80;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("reader.code()","token::code::false_value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x2a,"void basic_suite::value_false()",local_90,&local_94);
  local_ac[0] = trial::protocol::bintoken::reader::symbol((reader *)local_88);
  local_b0 = 3;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("reader.symbol()","token::symbol::boolean",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x2b,"void basic_suite::value_false()",local_ac,&local_b0);
  local_b8[0] = trial::protocol::bintoken::reader::category((reader *)local_88);
  ex._4_4_ = 2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("reader.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x2c,"void basic_suite::value_false()",local_b8,(long)&ex + 4);
  sVar1 = trial::protocol::bintoken::reader::length((reader *)local_88);
  boost::detail::test_impl
            ("reader.length() == 1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x2d,"void basic_suite::value_false()",sVar1 == 1);
  ex._2_1_ = trial::protocol::bintoken::reader::value<trial::protocol::bintoken::token::boolean>
                       ((reader *)local_88);
  ex._1_1_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.value<token::boolean>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x2f,"void basic_suite::value_false()",(long)&ex + 2,(long)&ex + 1);
  trial::protocol::bintoken::reader::value<trial::protocol::bintoken::token::int8>
            ((reader *)local_88);
  trial::protocol::core::detail::throw_failed_impl
            ("reader.value<token::int8>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x31,"void basic_suite::value_false()");
  trial::protocol::bintoken::reader::value<trial::protocol::bintoken::token::int16>
            ((reader *)local_88);
  trial::protocol::core::detail::throw_failed_impl
            ("reader.value<token::int16>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x33,"void basic_suite::value_false()");
  trial::protocol::bintoken::reader::value<trial::protocol::bintoken::token::int32>
            ((reader *)local_88);
  trial::protocol::core::detail::throw_failed_impl
            ("reader.value<token::int32>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x35,"void basic_suite::value_false()");
  trial::protocol::bintoken::reader::value<trial::protocol::bintoken::token::int64>
            ((reader *)local_88);
  trial::protocol::core::detail::throw_failed_impl
            ("reader.value<token::int64>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x37,"void basic_suite::value_false()");
  trial::protocol::bintoken::reader::value<trial::protocol::bintoken::token::float32>
            ((reader *)local_88);
  trial::protocol::core::detail::throw_failed_impl
            ("reader.value<token::float32>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x39,"void basic_suite::value_false()");
  trial::protocol::bintoken::reader::value<trial::protocol::bintoken::token::float64>
            ((reader *)local_88);
  trial::protocol::core::detail::throw_failed_impl
            ("reader.value<token::float64>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x3b,"void basic_suite::value_false()");
  ex_6._5_1_ = trial::protocol::bintoken::reader::value<bool>((reader *)local_88);
  ex_6._4_1_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.value<bool>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x3d,"void basic_suite::value_false()",(long)&ex_6 + 5,(long)&ex_6 + 4);
  trial::protocol::bintoken::reader::value<int>((reader *)local_88);
  trial::protocol::core::detail::throw_failed_impl
            ("reader.value<int>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x3f,"void basic_suite::value_false()");
  local_20b[0] = trial::protocol::bintoken::reader::next((reader *)local_88);
  local_20c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x40,"void basic_suite::value_false()",local_20b,&local_20c);
  local_214[0] = trial::protocol::bintoken::reader::code((reader *)local_88);
  local_218 = 0;
  ui = "token::code::end";
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("reader.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x41,"void basic_suite::value_false()",local_214,&local_218);
  trial::protocol::bintoken::reader::~reader((reader *)local_88,(UI *)ui,uis);
  return;
}

Assistant:

void value_false()
{
    const value_type input[] = { token::code::false_value };
    format::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::false_value);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.symbol(), token::symbol::boolean);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.category(), token::category::data);
    TRIAL_PROTOCOL_TEST(reader.length() == 1);
    // Without conversion
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<token::boolean>(), false);
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<token::int8>(),
                                    format::error, "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<token::int16>(),
                                    format::error, "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<token::int32>(),
                                    format::error, "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<token::int64>(),
                                    format::error, "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<token::float32>(),
                                    format::error, "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<token::float64>(),
                                    format::error, "incompatible type");
    // With conversion
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<bool>(), false);
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<int>(),
                                    format::error, "invalid value");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end);
}